

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::error(Parser *this,string *message)

{
  ostream *poVar1;
  logic_error *this_00;
  undefined1 local_38 [40];
  string *message_local;
  Parser *this_local;
  
  local_38._32_8_ = message;
  message_local = (string *)this;
  poVar1 = std::operator<<((ostream *)&std::cout,"PARSE ERROR!");
  poVar1 = std::operator<<(poVar1,(string *)message);
  std::operator<<(poVar1," ");
  poVar1 = std::operator<<((ostream *)&std::cout,"Current token: ");
  Lexer::current_token(this->lex);
  Token::get_lexeme_abi_cxx11_((Token *)local_38);
  poVar1 = std::operator<<(poVar1,(string *)local_38);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)local_38);
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error(this_00,(string *)message);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void Parser::error(const string message)
{
	cout << "PARSE ERROR!" << message << " ";
	cout << "Current token: " << lex->current_token()->get_lexeme() << endl;

	throw logic_error(message);
}